

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  BYTE *pBVar1;
  byte bVar2;
  BYTE BVar3;
  undefined8 uVar4;
  ushort uVar5;
  U32 length;
  ushort *puVar6;
  ushort *puVar7;
  BYTE *pBVar8;
  int iVar9;
  uint uVar10;
  BYTE *pBVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  ushort uVar18;
  ulong offset;
  BYTE *pBVar19;
  BYTE *d_2;
  size_t __n;
  BYTE *s;
  BYTE *d;
  BYTE *pBVar20;
  BYTE *local_38;
  
  if (source == (char *)0x0) {
    source = (char *)0xffffffff;
  }
  else if (originalSize == 0) {
    source = (char *)(ulong)(-(uint)(*source != '\0') | 1);
  }
  else {
    pBVar1 = (BYTE *)(dest + originalSize);
    pBVar19 = (BYTE *)(dest + (long)originalSize + -8);
    pBVar15 = (BYTE *)(dest + (long)originalSize + -0x1a);
    iVar12 = (int)source;
    if (0x3f < originalSize) {
LAB_00116e55:
      bVar2 = (byte)*(ushort *)source;
      uVar13 = (uint)bVar2;
      uVar10 = (uint)(bVar2 >> 4);
      if (uVar10 == 0xf) {
        uVar10 = 0;
        puVar7 = (ushort *)((long)source + 0x10);
        do {
          puVar6 = puVar7;
          uVar10 = uVar10 + *(byte *)((long)puVar6 + -0xf);
          puVar7 = (ushort *)((long)puVar6 + 1);
        } while (*(byte *)((long)puVar6 + -0xf) == 0xff);
        uVar14 = (ulong)uVar10;
        pBVar20 = (BYTE *)dest + uVar14 + 0xf;
        source = (char *)(puVar6 + -7);
        iVar9 = 6;
        if (pBVar20 <= pBVar19) {
          do {
            *(undefined8 *)dest = *(undefined8 *)source;
            dest = (char *)((BYTE *)dest + 8);
            source = (char *)((long)source + 8);
          } while (dest < pBVar20);
          source = (char *)((long)puVar6 + 1 + uVar14);
          iVar9 = 0;
          dest = (char *)pBVar20;
        }
        if (iVar9 != 0) goto LAB_00116fc5;
      }
      else {
        *(undefined8 *)dest = *(undefined8 *)((long)source + 1);
        if (0x8f < bVar2) {
          *(undefined8 *)((BYTE *)dest + 8) = *(undefined8 *)((long)source + 9);
        }
        source = (char *)((byte *)((long)source + 1) + uVar10);
        dest = (char *)((BYTE *)dest + uVar10);
      }
      pBVar20 = (BYTE *)dest;
      uVar18 = *(ushort *)source;
      offset = (ulong)uVar18;
      source = (char *)((long)source + 2);
      pBVar16 = pBVar20 + -offset;
      uVar14 = (ulong)(bVar2 & 0xf);
      if (uVar14 == 0xf) {
        uVar10 = 0;
        do {
          uVar5 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar10 = uVar10 + (byte)uVar5;
        } while ((byte)uVar5 == 0xff);
        uVar14 = (ulong)uVar10 + 0x13;
        if (pBVar1 + -0x40 <= pBVar20 + (ulong)uVar10 + 0x13) goto LAB_001170dc;
LAB_00116f5d:
        dest = (char *)(pBVar20 + uVar14);
        if (uVar18 < 0x10) {
          LZ4_memcpy_using_offset(pBVar20,pBVar16,(BYTE *)dest,offset);
        }
        else {
          do {
            uVar4 = *(undefined8 *)(pBVar20 + -offset + 8);
            *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar20 + -offset);
            *(undefined8 *)(pBVar20 + 8) = uVar4;
            uVar4 = *(undefined8 *)(pBVar20 + -offset + 0x10 + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar20 + -offset + 0x10);
            *(undefined8 *)(pBVar20 + 0x18) = uVar4;
            pBVar20 = pBVar20 + 0x20;
          } while (pBVar20 < dest);
        }
      }
      else {
        dest = (char *)(pBVar20 + uVar14 + 4);
        uVar14 = uVar14 + 4;
        if (pBVar1 + -0x40 <= dest) goto LAB_001170dc;
        if (uVar18 < 8) goto LAB_00116f5d;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar16;
        *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar16 + 8);
        *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
      }
      goto LAB_00116e55;
    }
LAB_0011712f:
    do {
      bVar2 = (byte)*(ushort *)source;
      source = (char *)((long)source + 1);
      while( true ) {
        uVar13 = (uint)bVar2;
        __n = (size_t)(uint)(bVar2 >> 4);
        if ((0x8f < uVar13) || (pBVar15 < dest)) break;
        *(undefined8 *)dest = *(undefined8 *)source;
        pBVar20 = (BYTE *)dest + __n;
        uVar14 = (ulong)(uVar13 & 0xf);
        puVar7 = (ushort *)((long)source + __n);
        uVar18 = *puVar7;
        pBVar16 = pBVar20 + -(ulong)uVar18;
        if (((uVar13 & 0xf) == 0xf) || (uVar18 < 8)) goto LAB_001170b8;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar16;
        *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar16 + 8);
        *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
        dest = (char *)(pBVar20 + uVar14 + 4);
        bVar2 = *(byte *)((long)source + __n + 2);
        source = (char *)((long)source + __n + 3);
      }
      if (bVar2 >> 4 == 0xf) {
        uVar10 = 0;
        do {
          uVar18 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar10 = uVar10 + (byte)uVar18;
        } while ((byte)uVar18 == 0xff);
        __n = (ulong)uVar10 + 0xf;
      }
      pBVar20 = (BYTE *)dest + __n;
LAB_00117083:
      puVar7 = (ushort *)source;
      if (pBVar19 < pBVar20) {
        if (pBVar20 != pBVar1) goto LAB_00117148;
        memmove(dest,source,__n);
        source = (char *)(ulong)(uint)(((int)source + (int)__n) - iVar12);
        goto LAB_00117167;
      }
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar7;
        dest = (char *)((BYTE *)dest + 8);
        puVar7 = puVar7 + 4;
      } while (dest < pBVar20);
      puVar7 = (ushort *)((long)source + __n);
      uVar18 = *puVar7;
      pBVar16 = pBVar20 + -(ulong)uVar18;
      uVar14 = (ulong)(uVar13 & 0xf);
LAB_001170b8:
      source = (char *)(puVar7 + 1);
      if ((int)uVar14 == 0xf) {
        uVar10 = 0;
        do {
          uVar5 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar10 = uVar10 + (byte)uVar5;
        } while ((byte)uVar5 == 0xff);
        uVar14 = (ulong)uVar10 + 0xf;
      }
      uVar14 = uVar14 + 4;
LAB_001170dc:
      dest = (char *)(pBVar20 + uVar14);
      if (uVar18 < 8) {
        LZ4_decompress_fast_cold_1();
        pBVar16 = local_38;
      }
      else {
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar16;
        pBVar16 = pBVar16 + 8;
      }
      pBVar8 = pBVar20 + 8;
      if (dest <= pBVar1 + -0xc) {
        *(undefined8 *)pBVar8 = *(undefined8 *)pBVar16;
        if (0x10 < uVar14) {
          pBVar20 = pBVar20 + 0x10;
          do {
            pBVar16 = pBVar16 + 8;
            *(undefined8 *)pBVar20 = *(undefined8 *)pBVar16;
            pBVar20 = pBVar20 + 8;
          } while (pBVar20 < dest);
        }
        goto LAB_0011712f;
      }
      iVar9 = 5;
      if (dest <= pBVar1 + -5) {
        pBVar20 = pBVar1 + -7;
        pBVar11 = pBVar16;
        pBVar17 = pBVar8;
        if (pBVar8 < pBVar20) {
          do {
            *(undefined8 *)pBVar17 = *(undefined8 *)pBVar11;
            pBVar17 = pBVar17 + 8;
            pBVar11 = pBVar11 + 8;
          } while (pBVar17 < pBVar20);
          pBVar16 = pBVar16 + ((long)pBVar20 - (long)pBVar8);
          pBVar8 = pBVar20;
        }
        iVar9 = 0;
        for (; pBVar8 < dest; pBVar8 = pBVar8 + 1) {
          BVar3 = *pBVar16;
          pBVar16 = pBVar16 + 1;
          *pBVar8 = BVar3;
        }
      }
    } while (iVar9 == 0);
    if (iVar9 == 5) {
LAB_00117148:
      source = (char *)(ulong)(~(uint)source + iVar12);
    }
  }
LAB_00117167:
  return (int)source;
LAB_00116fc5:
  if (iVar9 == 6) {
    __n = uVar14 + 0xf;
    goto LAB_00117083;
  }
  goto LAB_00117167;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}